

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void ArrayClear(array *a)

{
  char *pcVar1;
  cc_memheap *Heap;
  
  pcVar1 = a->_Begin;
  if (pcVar1 != (char *)0x0) {
    Heap = *(cc_memheap **)(pcVar1 + -0x10);
    if ((long)Heap < 0) {
      if (((ulong)Heap & 0x3fffffffffffffff) != 0) {
        (*Heap->Free)(Heap,pcVar1 + -0x10,((ulong)Heap & 0x3fffffffffffffff) + 0x10);
      }
      ArrayInitEx(a,Heap);
      return;
    }
    if ((cc_memheap *)0x3fffffffffffffff < Heap) {
      free(pcVar1 + -0x10);
    }
    a->_Begin = (char *)0x0;
    a->_Used = 0;
  }
  return;
}

Assistant:

NOINLINE void ArrayClear(array* a)
{
    if (!a->_Begin)
        return;
    datahead *hp = Data_Head(a);
    if (Data_IsMemHeap(hp))
    {
        dataheaphead *dp = Data_HeapHead(a);
        const struct cc_memheap* Heap = dp->Heap;
        if (Data_GetSize(hp))
            MemHeap_Free(Heap,dp,Data_GetSize(hp)+sizeof(dataheaphead));
        ArrayInitEx(a, Heap);
    }
    else if (Data_IsHeap(hp))
    {
        free(hp);
        a->_Begin = NULL;
        a->_Used = 0;
    }
    else
    {
        a->_Begin = NULL;
        a->_Used = 0;
    }
}